

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

int __thiscall Random_keys::avancaGeracoes2(Random_keys *this,Graph *g)

{
  pointer ppRVar1;
  RK_Individual *pRVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Random_keys *this_00;
  uint uVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double local_60;
  
  uVar5 = (long)this->tamPop - 1;
  ppRVar1 = (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar5) {
LAB_001070b1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
  }
  pRVar2 = ppRVar1[(long)this->tamPop + -1];
  ordenaPopulacaoAtual(this,g);
  if (this->numGeracoes < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar14 = 0;
    local_60 = pRVar2->active_loss * 100000.0;
    do {
      ordenaPopulacaoAtual(this,g);
      uVar5 = (long)this->tamPop - 1;
      ppRVar1 = (this->popAtual).
                super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar5)
      goto LAB_001070b1;
      dVar17 = ppRVar1[(long)this->tamPop + -1]->active_loss * 100000.0;
      if (dVar17 < local_60) {
        iVar9 = iVar14;
      }
      std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
                (&this->popAnterior,&this->popAtual);
      dVar16 = (double)this->tamPop;
      uVar4 = (uint)(dVar16 * 0.05);
      iVar15 = (int)(dVar16 * 0.1);
      if ((int)uVar4 < this->tamPop - iVar15) {
        uVar10 = (ulong)(int)uVar4;
        do {
          rand();
          iVar3 = rand();
          uVar8 = iVar3 % this->tamPop;
          iVar3 = rand();
          uVar13 = iVar3 % this->tamPop;
          iVar3 = rand();
          uVar7 = (long)iVar3 % (long)this->tamPop;
          uVar12 = uVar7 & 0xffffffff;
          uVar11 = (ulong)(int)uVar8;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (long)(this->popAnterior).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar5 = uVar11;
          if ((uVar6 <= uVar11) || (uVar5 = (ulong)(int)uVar13, uVar6 <= uVar5)) goto LAB_001070b1;
          if (ppRVar1[uVar11]->active_loss <= ppRVar1[uVar5]->active_loss &&
              ppRVar1[uVar5]->active_loss != ppRVar1[uVar11]->active_loss) {
            uVar13 = uVar8;
          }
          uVar11 = (ulong)(int)uVar13;
          uVar5 = uVar11;
          if ((uVar6 <= uVar11) || (uVar5 = (ulong)(int)uVar7, uVar6 <= uVar5)) goto LAB_001070b1;
          if (ppRVar1[uVar11]->active_loss <= ppRVar1[uVar5]->active_loss &&
              ppRVar1[uVar5]->active_loss != ppRVar1[uVar11]->active_loss) {
            uVar12 = (ulong)uVar13;
          }
          do {
            iVar3 = rand();
            iVar3 = iVar3 % this->tamPop;
          } while (iVar3 == (int)uVar12);
          uVar12 = (ulong)(int)uVar12;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar7 = (long)(this->popAnterior).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar5 = uVar12;
          if (((uVar7 <= uVar12) || (uVar6 = (ulong)iVar3, uVar5 = uVar6, uVar7 <= uVar6)) ||
             (this_00 = (Random_keys *)
                        (this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_start, uVar5 = uVar10,
             (ulong)((long)(this->popAtual).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) <= uVar10
             )) goto LAB_001070b1;
          cruzamento2(this_00,ppRVar1[uVar12],ppRVar1[uVar6],
                      *(RK_Individual **)(&this_00->numGeracoes + uVar10 * 2));
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
              uVar10) goto LAB_001070b1;
          mutacao(this_00,ppRVar1[uVar10]);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)this->tamPop - (long)iVar15);
      }
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar5
             ) goto LAB_001070b1;
          RK_Individual::generate_random_weights(ppRVar1[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (local_60 <= dVar17) {
        dVar17 = local_60;
      }
      iVar14 = iVar14 + 1;
      local_60 = dVar17;
    } while (iVar14 < this->numGeracoes);
  }
  ordenaPopulacaoAtual(this,g);
  return iVar9;
}

Assistant:

int Random_keys::avancaGeracoes2(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}